

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O1

bool __thiscall CaptureSummary::Save(CaptureSummary *this,char *file_name)

{
  pointer pp_Var1;
  _capture_line *p_Var2;
  FILE *__stream;
  char *pcVar3;
  size_t i;
  ulong uVar4;
  
  __stream = (FILE *)ithi_file_open(file_name,"w");
  if (__stream != (FILE *)0x0) {
    pcVar3 = DnsStats::GetTableName(0);
    fprintf(__stream,"\"%s\",0,0,%d,\n",pcVar3,(ulong)(uint)this->capture_version);
    uVar4 = 0;
    do {
      pp_Var1 = (this->summary).
                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->summary).
                        super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3) <= uVar4) {
        fclose(__stream);
        break;
      }
      p_Var2 = pp_Var1[uVar4];
      fprintf(__stream,"%s,%d,",p_Var2,(ulong)(uint)p_Var2->key_type);
      if (p_Var2->key_type == 0) {
        fprintf(__stream,"%d,",(ulong)(uint)(p_Var2->field_2).key_number);
      }
      else {
        fprintf(__stream,"%s,");
      }
      fprintf(__stream,"%lld,\n",p_Var2->count);
      uVar4 = uVar4 + 1;
    } while (__stream != (FILE *)0x0);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool CaptureSummary::Save(char const * file_name)
{
    FILE* F = ithi_file_open(file_name, "w");
    bool ret = (F != NULL);

    if (ret) {
        /* TODO: write the version number */
        fprintf(F, "\"%s\",0,0,%d,\n", DnsStats::GetTableName(REGISTRY_ITHITOOLS_VERSION), capture_version);
    }

    for (size_t i = 0; ret && i < summary.size(); i++)
    {
        CaptureLine * line = summary[i];

        // Print current line
        fprintf(F, """%s"",%d,", line->registry_name, line->key_type);

        if (line->key_type == 0)
        {
            fprintf(F, "%d,", line->key_number);
        }
        else
        {
            fprintf(F, """%s"",", line->key_value);
        }

        fprintf(F, """%lld"",\n", (long long)line->count);
    }

    if (F != NULL)
    {
        fclose(F);
    }

    return ret;
}